

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_doregion(_glist *x,int xpos,int ypos,int doit)

{
  int local_2c;
  int local_28;
  int hiy;
  int hix;
  int loy;
  int lox;
  int doit_local;
  int ypos_local;
  int xpos_local;
  _glist *x_local;
  
  if (doit == 0) {
    pdgui_vmess((char *)0x0,"crs iiii",x,"coords","x",(ulong)(uint)x->gl_editor->e_xwas,
                x->gl_editor->e_ywas,xpos,ypos);
  }
  else {
    if (x->gl_editor->e_xwas < xpos) {
      hix = x->gl_editor->e_xwas;
      local_28 = xpos;
    }
    else {
      local_28 = x->gl_editor->e_xwas;
      hix = xpos;
    }
    if (x->gl_editor->e_ywas < ypos) {
      hiy = x->gl_editor->e_ywas;
      local_2c = ypos;
    }
    else {
      local_2c = x->gl_editor->e_ywas;
      hiy = ypos;
    }
    canvas_selectinrect(x,hix,hiy,local_28,local_2c);
    pdgui_vmess((char *)0x0,"crs",x,"delete","x");
    x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8;
  }
  return;
}

Assistant:

static void canvas_doregion(t_canvas *x, int xpos, int ypos, int doit)
{
    if (doit)
    {
        int lox, loy, hix, hiy;
        if (x->gl_editor->e_xwas < xpos)
            lox = x->gl_editor->e_xwas, hix = xpos;
        else hix = x->gl_editor->e_xwas, lox = xpos;
        if (x->gl_editor->e_ywas < ypos)
            loy = x->gl_editor->e_ywas, hiy = ypos;
        else hiy = x->gl_editor->e_ywas, loy = ypos;
        canvas_selectinrect(x, lox, loy, hix, hiy);
        pdgui_vmess(0, "crs", x, "delete", "x");
        x->gl_editor->e_onmotion = MA_NONE;
    }
    else
        pdgui_vmess(0, "crs iiii",
            x, "coords", "x",
            x->gl_editor->e_xwas,x->gl_editor->e_ywas, xpos,ypos);
}